

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling_info-c.cpp
# Opt level: O2

duckdb_value duckdb_profiling_info_get_value(duckdb_profiling_info info,char *key)

{
  MetricsType metric;
  bool bVar1;
  size_t length;
  duckdb_value p_Var2;
  string str;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (info != (duckdb_profiling_info)0x0) {
    std::__cxx11::string::string((string *)&local_38,key,&local_59);
    duckdb::StringUtil::Upper(&local_58,&local_38);
    metric = duckdb::EnumUtil::FromString<duckdb::MetricsType>(local_58._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = duckdb::ProfilingInfo::Enabled((profiler_settings_t *)(info + 8),metric);
    if (bVar1) {
      duckdb::ProfilingInfo::GetMetricAsString_abi_cxx11_
                (&local_58,(ProfilingInfo *)(info + 8),metric);
      length = strlen(local_58._M_dataplus._M_p);
      p_Var2 = duckdb_create_varchar_length(local_58._M_dataplus._M_p,length);
      std::__cxx11::string::~string((string *)&local_58);
      return p_Var2;
    }
  }
  return (duckdb_value)0x0;
}

Assistant:

duckdb_value duckdb_profiling_info_get_value(duckdb_profiling_info info, const char *key) {
	if (!info) {
		return nullptr;
	}
	auto &node = *reinterpret_cast<duckdb::ProfilingNode *>(info);
	auto &profiling_info = node.GetProfilingInfo();
	auto key_enum = EnumUtil::FromString<MetricsType>(duckdb::StringUtil::Upper(key));
	if (!profiling_info.Enabled(profiling_info.settings, key_enum)) {
		return nullptr;
	}

	auto str = profiling_info.GetMetricAsString(key_enum);
	return duckdb_create_varchar_length(str.c_str(), strlen(str.c_str()));
}